

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O0

int Vertical_Scrolling(_func_int_FORM_ptr *fct,FORM *form)

{
  int local_1c;
  int res;
  FORM *form_local;
  _func_int_FORM_ptr *fct_local;
  
  local_1c = -0xc;
  if (((int)form->current->rows + form->current->nrow != 1) &&
     (local_1c = (*fct)(form), local_1c == 0)) {
    form->current->status = form->current->status | 2;
  }
  return local_1c;
}

Assistant:

static int Vertical_Scrolling(int (* const fct) (FORM *), FORM * form)
{
  int res = E_REQUEST_DENIED;

  if (!Single_Line_Field(form->current))
    {
      res = fct(form);
      if (res == E_OK)
        form->current->status |= _NEWTOP;
    }
  return(res);
}